

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OtherVisitor.cpp
# Opt level: O1

void __thiscall OpenMD::XYZVisitor::internalVisit(XYZVisitor *this,StuntDouble *sd)

{
  _func_int **pp_Var1;
  undefined1 auVar2 [8];
  SnapshotManager *pSVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  SnapshotManager *pSVar4;
  _func_int *p_Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  _func_int **pp_Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_03;
  string line;
  char buffer [1024];
  value_type local_480;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_460;
  undefined1 local_458 [8];
  undefined8 uStack_450;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_448;
  SnapshotManager *local_440;
  char local_438 [1032];
  
  local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,"ATOMDATA","");
  StuntDouble::getPropertyByName((StuntDouble *)local_458,(string *)sd);
  this_03 = uStack_450;
  auVar2 = local_458;
  uStack_450._0_4_ = otAtom;
  uStack_450._4_4_ = 0;
  local_458 = (undefined1  [8])0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_480._M_dataplus._M_p != &local_480.field_2) {
    operator_delete(local_480._M_dataplus._M_p,
                    CONCAT71(local_480.field_2._M_allocated_capacity._1_7_,
                             local_480.field_2._M_local_buf[0]) + 1);
  }
  if (auVar2 == (undefined1  [8])0x0) {
    this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    pSVar3 = (SnapshotManager *)__dynamic_cast(auVar2,&GenericData::typeinfo,&AtomData::typeinfo,0);
    pSVar4 = (SnapshotManager *)0x0;
    this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if ((pSVar3 != (SnapshotManager *)0x0) &&
       (pSVar4 = pSVar3, this_01 = this_03,
       this_03 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_03->_M_use_count = this_03->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_03->_M_use_count = this_03->_M_use_count + 1;
      }
    }
    if (pSVar4 != (SnapshotManager *)0x0) {
      pp_Var1 = pSVar4[1]._vptr_SnapshotManager;
      if (pp_Var1 == *(_func_int ***)&pSVar4[1].atomStorageLayout_) {
        p_Var5 = (_func_int *)0x0;
        this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        p_Var5 = *pp_Var1;
        this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pp_Var1[1];
        if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_02->_M_use_count = this_02->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_02->_M_use_count = this_02->_M_use_count + 1;
          }
        }
      }
      local_440 = pSVar4;
      if (p_Var5 != (_func_int *)0x0) {
        local_460 = this_03;
        local_448 = &this->frame;
        this_00 = this_02;
        do {
          pp_Var6 = pp_Var1 + 2;
          local_480._M_string_length = 0;
          local_480.field_2._M_local_buf[0] = '\0';
          local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
          snprintf(local_438,0x400,"%s",*(undefined8 *)p_Var5);
          std::__cxx11::string::append((char *)&local_480);
          if (this->doPositions_ == true) {
            snprintf(local_438,0x400,"%15.8f%15.8f%15.8f",(int)*(undefined8 *)(p_Var5 + 0x28),
                     *(undefined8 *)(p_Var5 + 0x30),*(undefined8 *)(p_Var5 + 0x38));
            std::__cxx11::string::append((char *)&local_480);
          }
          if ((this->doCharges_ == true) && (p_Var5[0xa8] == (_func_int)0x1)) {
            snprintf(local_438,0x400,"%15.8f",(int)*(undefined8 *)(p_Var5 + 0xa0));
            std::__cxx11::string::append((char *)&local_480);
          }
          if ((this->doVectors_ == true) && (p_Var5[0xa9] == (_func_int)0x1)) {
            snprintf(local_438,0x400,"%15.8f%15.8f%15.8f",(int)*(undefined8 *)(p_Var5 + 0x40),
                     *(undefined8 *)(p_Var5 + 0x48),*(undefined8 *)(p_Var5 + 0x50));
            std::__cxx11::string::append((char *)&local_480);
          }
          if ((this->doVelocities_ == true) && (p_Var5[0xaa] == (_func_int)0x1)) {
            snprintf(local_438,0x400,"%15.8f%15.8f%15.8f",(int)*(undefined8 *)(p_Var5 + 0x58),
                     *(undefined8 *)(p_Var5 + 0x60),*(undefined8 *)(p_Var5 + 0x68));
            std::__cxx11::string::append((char *)&local_480);
          }
          if ((this->doForces_ == true) && (p_Var5[0xab] == (_func_int)0x1)) {
            snprintf(local_438,0x400,"%15.8f%15.8f%15.8f",(int)*(undefined8 *)(p_Var5 + 0x70),
                     *(undefined8 *)(p_Var5 + 0x78),*(undefined8 *)(p_Var5 + 0x80));
            std::__cxx11::string::append((char *)&local_480);
          }
          if ((this->doElectricFields_ == true) && (p_Var5[0xac] == (_func_int)0x1)) {
            snprintf(local_438,0x400,"%15.8f%15.8f%15.8f",(int)*(undefined8 *)(p_Var5 + 0x88),
                     *(undefined8 *)(p_Var5 + 0x90),*(undefined8 *)(p_Var5 + 0x98));
            std::__cxx11::string::append((char *)&local_480);
          }
          if (this->doGlobalIDs_ == true) {
            snprintf(local_438,0x400,"%10d",(ulong)*(uint *)(p_Var5 + 0x20));
            std::__cxx11::string::append((char *)&local_480);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(local_448,&local_480);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_480._M_dataplus._M_p != &local_480.field_2) {
            operator_delete(local_480._M_dataplus._M_p,
                            CONCAT71(local_480.field_2._M_allocated_capacity._1_7_,
                                     local_480.field_2._M_local_buf[0]) + 1);
          }
          if (pp_Var6 == *(_func_int ***)&local_440[1].atomStorageLayout_) {
            p_Var5 = (_func_int *)0x0;
            this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          }
          else {
            p_Var5 = *pp_Var6;
            this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pp_Var1[3];
            if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                this_02->_M_use_count = this_02->_M_use_count + 1;
                UNLOCK();
              }
              else {
                this_02->_M_use_count = this_02->_M_use_count + 1;
              }
            }
          }
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
          this_00 = this_02;
          this_03 = local_460;
          pp_Var1 = pp_Var6;
        } while (p_Var5 != (_func_int *)0x0);
      }
      goto LAB_0021ed6e;
    }
  }
  this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_0021ed6e:
  if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  if (this_03 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_03);
  }
  return;
}

Assistant:

void XYZVisitor::internalVisit(StuntDouble* sd) {
    std::shared_ptr<GenericData> data;
    std::shared_ptr<AtomData> atomData;
    std::shared_ptr<AtomInfo> atomInfo;
    std::vector<std::shared_ptr<AtomInfo>>::iterator i;
    char buffer[1024];

    // if there is not atom data, just skip it
    data = sd->getPropertyByName("ATOMDATA");

    if (data != nullptr) {
      atomData = std::dynamic_pointer_cast<AtomData>(data);

      if (atomData == nullptr) return;
    } else
      return;

    for (atomInfo = atomData->beginAtomInfo(i); atomInfo;
         atomInfo = atomData->nextAtomInfo(i)) {
      std::string line;
      snprintf(buffer, 1024, "%s", atomInfo->atomTypeName.c_str());
      line += buffer;

      if (doPositions_) {
        snprintf(buffer, 1024, "%15.8f%15.8f%15.8f", atomInfo->pos[0],
                 atomInfo->pos[1], atomInfo->pos[2]);
        line += buffer;
      }
      if (doCharges_ && atomInfo->hasCharge) {
        snprintf(buffer, 1024, "%15.8f", atomInfo->charge);
        line += buffer;
      }
      if (doVectors_ && atomInfo->hasVector) {
        snprintf(buffer, 1024, "%15.8f%15.8f%15.8f", atomInfo->vec[0],
                 atomInfo->vec[1], atomInfo->vec[2]);
        line += buffer;
      }
      if (doVelocities_ && atomInfo->hasVelocity) {
        snprintf(buffer, 1024, "%15.8f%15.8f%15.8f", atomInfo->vel[0],
                 atomInfo->vel[1], atomInfo->vel[2]);
        line += buffer;
      }
      if (doForces_ && atomInfo->hasForce) {
        snprintf(buffer, 1024, "%15.8f%15.8f%15.8f", atomInfo->frc[0],
                 atomInfo->frc[1], atomInfo->frc[2]);
        line += buffer;
      }
      if (doElectricFields_ && atomInfo->hasElectricField) {
        snprintf(buffer, 1024, "%15.8f%15.8f%15.8f", atomInfo->eField[0],
                 atomInfo->eField[1], atomInfo->eField[2]);
        line += buffer;
      }
      if (doGlobalIDs_) {
        snprintf(buffer, 1024, "%10d", atomInfo->globalID);
        line += buffer;
      }

      frame.push_back(line);
    }
  }